

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,Ref func,u32 offset,Ptr *out_trap)

{
  Store *store;
  size_type sVar1;
  size_type sVar2;
  size_type local_80;
  size_type local_78;
  allocator<char> local_69;
  string local_68;
  Ptr local_48;
  Ptr *local_30;
  Ptr *out_trap_local;
  Thread *pTStack_20;
  u32 offset_local;
  Thread *this_local;
  Ref func_local;
  
  local_30 = out_trap;
  out_trap_local._4_4_ = offset;
  pTStack_20 = this;
  this_local = (Thread *)func.index;
  sVar1 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::size
                    (&this->frames_);
  sVar2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::capacity
                    (&this->frames_);
  if (sVar1 == sVar2) {
    store = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"call stack exhausted",&local_69);
    Trap::New(&local_48,store,&local_68,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(local_30,&local_48);
    func_local.index._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  else {
    local_78 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                         (&this->values_);
    local_80 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                         (&this->exceptions_);
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref&,unsigned_long,unsigned_long,unsigned_int&,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)this,
               (Ref *)&this_local,&local_78,&local_80,(uint *)((long)&out_trap_local + 4),
               &this->inst_,&this->mod_);
    func_local.index._4_4_ = Ok;
  }
  return func_local.index._4_4_;
}

Assistant:

RunResult Thread::PushCall(Ref func, u32 offset, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  frames_.emplace_back(func, values_.size(), exceptions_.size(), offset, inst_,
                       mod_);
  return RunResult::Ok;
}